

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportFunc
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  value_type *__x;
  pointer pFVar1;
  Result RVar2;
  Enum EVar3;
  Location loc;
  Location loc_1;
  long *local_140;
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *local_138;
  char *local_130;
  long *local_128;
  long local_120;
  long local_118 [2];
  long *local_108;
  long local_100;
  long local_f8 [2];
  Location local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8;
  Location local_98;
  Var local_78;
  
  local_130 = module_name._M_str;
  local_e8.field_1.field_0.last_column = 0;
  local_e8.filename._M_len = (this->filename_)._M_len;
  local_e8.filename._M_str = (this->filename_)._M_str;
  local_e8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_e8.field_1.field_1.offset;
  Var::Var(&local_78,sig_index,&local_98);
  RVar2 = SharedValidator::OnFunction(&this->validator_,&local_e8,&local_78);
  Var::~Var(&local_78);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pFVar1 = (this->module_->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __x = pFVar1 + sig_index;
    local_138 = &this->module_->imports;
    local_128 = local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,local_130,local_130 + module_name._M_len);
    local_108 = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,field_name._M_str,field_name._M_str + field_name._M_len);
    (**(code **)((long)pFVar1[sig_index].super_ExternType._vptr_ExternType + 0x10))(&local_140,__x);
    local_e8.filename._M_len = (size_t)&local_e8.field_1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_128,local_120 + (long)local_128);
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_108,local_100 + (long)local_108);
    local_a8 = local_140;
    local_140 = (long *)0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(local_138,(ImportDesc *)&local_e8);
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 8))();
    }
    local_a8 = (long *)0x0;
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_e8.filename._M_len != &local_e8.field_1) {
      operator_delete((void *)local_e8.filename._M_len,(long)local_e8.field_1.field_1.offset + 1);
    }
    if (local_140 != (long *)0x0) {
      (**(code **)(*local_140 + 8))();
    }
    local_140 = (long *)0x0;
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
    if (local_128 != local_118) {
      operator_delete(local_128,local_118[0] + 1);
    }
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,__x);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportFunc(Index import_index,
                                        std::string_view module_name,
                                        std::string_view field_name,
                                        Index func_index,
                                        Index sig_index) {
  CHECK_RESULT(
      validator_.OnFunction(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), func_type.Clone())});
  func_types_.push_back(func_type);
  return Result::Ok;
}